

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdialog.cpp
# Opt level: O0

void __thiscall QInputDialog::done(QInputDialog *this,int result)

{
  long lVar1;
  bool bVar2;
  InputMode IVar3;
  QPointer<QObject> *this_00;
  QObject *pQVar4;
  char *pcVar5;
  int in_ESI;
  QObject *in_RDI;
  long in_FS_OFFSET;
  InputMode mode;
  QInputDialogPrivate *d;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  QInputDialog *in_stack_ffffffffffffffa0;
  QInputDialog *in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QInputDialog *)0x79d56e);
  QDialog::done((QDialog *)in_RDI,in_stack_ffffffffffffffb4);
  if (in_ESI != 0) {
    IVar3 = inputMode((QInputDialog *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98))
    ;
    if (IVar3 == IntInput) {
      intValue((QInputDialog *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      intValueSelected((QInputDialog *)0x79d5e0,in_stack_ffffffffffffff9c);
    }
    else if (IVar3 == DoubleInput) {
      doubleValue((QInputDialog *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      doubleValueSelected((QInputDialog *)0x79d5c8,
                          (double)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    }
    else {
      textValue(in_stack_ffffffffffffffa8);
      textValueSelected(in_stack_ffffffffffffffa0,
                        (QString *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      QString::~QString((QString *)0x79d60a);
    }
  }
  bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QObject> *)0x79d61d);
  if (bVar2) {
    QByteArray::operator_cast_to_char_((QByteArray *)0x79d634);
    this_00 = (QPointer<QObject> *)signalForMember((char *)in_stack_ffffffffffffffa8);
    pQVar4 = ::QPointer::operator_cast_to_QObject_((QPointer<QObject> *)0x79d652);
    pcVar5 = QByteArray::operator_cast_to_char_((QByteArray *)0x79d668);
    QObject::disconnect(in_RDI,(char *)this_00,pQVar4,pcVar5);
    QPointer<QObject>::operator=
              (this_00,(QObject *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  }
  QByteArray::clear();
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QInputDialog::done(int result)
{
    Q_D(QInputDialog);
    QDialog::done(result);
    if (result) {
        InputMode mode = inputMode();
        switch (mode) {
        case DoubleInput:
            emit doubleValueSelected(doubleValue());
            break;
        case IntInput:
            emit intValueSelected(intValue());
            break;
        default:
            Q_ASSERT(mode == TextInput);
            emit textValueSelected(textValue());
        }
    }
    if (d->receiverToDisconnectOnClose) {
        disconnect(this, signalForMember(d->memberToDisconnectOnClose),
                   d->receiverToDisconnectOnClose, d->memberToDisconnectOnClose);
        d->receiverToDisconnectOnClose = nullptr;
    }
    d->memberToDisconnectOnClose.clear();
}